

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

cTValue * lj_debug_frame(lua_State *L,int level,int *size)

{
  int iVar1;
  long lVar2;
  cTValue *bot;
  cTValue *nextframe;
  cTValue *frame;
  int *size_local;
  int level_local;
  lua_State *L_local;
  
  bot = L->base + -1;
  nextframe = bot;
  size_local._4_4_ = level;
  while( true ) {
    if (nextframe <= (cTValue *)((L->stack).ptr64 + 8)) {
      *size = size_local._4_4_;
      return (cTValue *)0x0;
    }
    if ((lua_State *)(nextframe[-1].u64 & 0x7fffffffffff) == L) {
      size_local._4_4_ = size_local._4_4_ + 1;
    }
    if (size_local._4_4_ == 0) break;
    bot = nextframe;
    if ((nextframe->u64 & 3) == 0) {
      lVar2 = (ulong)((*(uint *)(nextframe->u64 - 4) >> 8 & 0xff) + 2) * -8;
      size_local._4_4_ = size_local._4_4_ + -1;
    }
    else {
      iVar1 = size_local._4_4_ + -1;
      if ((nextframe->u64 & 7) == 3) {
        iVar1 = size_local._4_4_;
      }
      size_local._4_4_ = iVar1;
      lVar2 = -(nextframe->u64 & 0xfffffffffffffff8);
    }
    nextframe = (cTValue *)((long)nextframe + lVar2);
  }
  *size = (int)((long)bot - (long)nextframe >> 3);
  return nextframe;
}

Assistant:

cTValue *lj_debug_frame(lua_State *L, int level, int *size)
{
  cTValue *frame, *nextframe, *bot = tvref(L->stack)+LJ_FR2;
  /* Traverse frames backwards. */
  for (nextframe = frame = L->base-1; frame > bot; ) {
    if (frame_gc(frame) == obj2gco(L))
      level++;  /* Skip dummy frames. See lj_err_optype_call(). */
    if (level-- == 0) {
      *size = (int)(nextframe - frame);
      return frame;  /* Level found. */
    }
    nextframe = frame;
    if (frame_islua(frame)) {
      frame = frame_prevl(frame);
    } else {
      if (frame_isvarg(frame))
	level++;  /* Skip vararg pseudo-frame. */
      frame = frame_prevd(frame);
    }
  }
  *size = level;
  return NULL;  /* Level not found. */
}